

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

void fix_feedback_for_inter(Am_Object *inter)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object feedback;
  Am_Object widget;
  Am_Object feedback_owner;
  Am_Object AStack_28;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)inter,10);
  in_value = Am_Object::Get(inter,0xdc,0);
  Am_Object::Am_Object(&AStack_28,in_value);
  Am_Object::Get_Object(&local_10,(Am_Slot_Key)&AStack_28,10);
  bVar1 = Am_Object::operator!=(&local_10,&local_20);
  if (bVar1) {
    Am_Object::Remove_From_Owner(&AStack_28);
    Am_Object::Am_Object(&local_18,&AStack_28);
    Am_Object::Add_Part(&local_20,&local_18,true,0);
    Am_Object::~Am_Object(&local_18);
  }
  Am_Object::~Am_Object(&local_10);
  Am_Object::~Am_Object(&AStack_28);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

void
fix_feedback_for_inter(Am_Object &inter)
{
  Am_Object widget = inter.Get_Owner();
  Am_Object feedback = inter.Get(Am_FEEDBACK_OBJECT);
  Am_Object feedback_owner = feedback.Get_Owner();
  if (feedback_owner != widget) {
    feedback.Remove_From_Owner();
    widget.Add_Part(feedback);
  }
}